

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void tcmalloc::ThreadCache::InitModule(void)

{
  char *__nptr;
  ThreadCache *pTVar1;
  bool bVar2;
  SpinLockHolder local_18;
  SpinLockHolder h;
  
  local_18.lock_ = (SpinLock *)(Static::pageheap_ + 8);
  LOCK();
  bVar2 = Static::pageheap_._8_4_ == 0;
  if (bVar2) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  if (phinited == '\0') {
    __nptr = TCMallocGetenvSafe("TCMALLOC_MAX_TOTAL_THREAD_CACHE_BYTES");
    if (__nptr != (char *)0x0) {
      overall_thread_cache_size_ = strtoll(__nptr,(char **)0x0,10);
      if (overall_thread_cache_size_ < min_per_thread_cache_size_) {
        overall_thread_cache_size_ = min_per_thread_cache_size_;
      }
      if (0x3fffffff < overall_thread_cache_size_) {
        overall_thread_cache_size_ = 0x40000000;
      }
      RecomputePerThreadCacheSize();
    }
    Static::InitStaticVars();
    threadcache_allocator._16_4_ = 0;
    threadcache_allocator._20_4_ = 0;
    threadcache_allocator._24_4_ = 0;
    threadcache_allocator._0_8_ = 0;
    threadcache_allocator._8_4_ = 0;
    threadcache_allocator._12_4_ = 0;
    pTVar1 = PageHeapAllocator<tcmalloc::ThreadCache>::New
                       ((PageHeapAllocator<tcmalloc::ThreadCache> *)threadcache_allocator);
    pTVar1->list_[0].list_ =
         (void *)CONCAT44(threadcache_allocator._20_4_,threadcache_allocator._16_4_);
    threadcache_allocator._16_4_ = SUB84(pTVar1,0);
    threadcache_allocator._20_4_ = (undefined4)((ulong)pTVar1 >> 0x20);
    threadcache_allocator._24_4_ = threadcache_allocator._24_4_ + -1;
    SetupMallocExtension();
    phinited = '\x01';
    SpinLockHolder::~SpinLockHolder(&local_18);
    Static::InitLateMaybeRecursive();
  }
  else {
    SpinLockHolder::~SpinLockHolder(&local_18);
  }
  return;
}

Assistant:

void ThreadCache::InitModule() {
  {
    SpinLockHolder h(Static::pageheap_lock());
    if (phinited) {
      return;
    }
    const char *tcb = TCMallocGetenvSafe("TCMALLOC_MAX_TOTAL_THREAD_CACHE_BYTES");
    if (tcb) {
      set_overall_thread_cache_size(strtoll(tcb, nullptr, 10));
    }
    Static::InitStaticVars();
    threadcache_allocator.Init();
    SetupMallocExtension();
    phinited = 1;
  }

  // We do "late" part of initialization without holding lock since
  // there is chance it'll recurse into malloc
  Static::InitLateMaybeRecursive();

#ifndef NDEBUG
  // pthread_atfork above may malloc sometimes. Lets ensure we test
  // that malloc works from here.
  (operator delete)((operator new)(1));
#endif
}